

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::sanitize_append_path_element(aux *this,string *path,string_view element)

{
  int iVar1;
  aux *paVar2;
  string *psVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  ulong uVar7;
  int *piVar8;
  unsigned_long __pos;
  string_view str;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined8 local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined8 local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int j;
  int dot;
  size_t k;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  pair<int,_int> local_44;
  int local_3c;
  ulong uStack_38;
  int32_t code_point;
  size_t i;
  int seq_len;
  bool found_extension;
  int iStack_24;
  char num_dots;
  int added;
  int added_separator;
  string *path_local;
  string_view element_local;
  
  element_local._M_len = element._M_len;
  _added = this;
  path_local = path;
  sVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&path_local);
  if ((sVar5 != 1) ||
     (pvVar6 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&path_local,0),
     *pvVar6 != '.')) {
    paVar2 = _added;
    ::std::__cxx11::string::size();
    ::std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)&path_local);
    ::std::__cxx11::string::reserve((ulong)paVar2);
    iStack_24 = 0;
    uVar7 = ::std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      ::std::__cxx11::string::operator+=((string *)_added,'/');
      iStack_24 = 1;
    }
    bVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&path_local);
    if (bVar4) {
      ::std::__cxx11::string::operator+=((string *)_added,"_");
    }
    else {
      seq_len = 0;
      i._7_1_ = '\0';
      i._6_1_ = 0;
      i._0_4_ = 0;
      for (uStack_38 = 0; uVar7 = uStack_38,
          sVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&path_local),
          uVar7 < sVar5; uStack_38 = (long)(int)i + uStack_38) {
        local_58 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)&path_local,
                              uStack_38,0xffffffffffffffff);
        str._M_str = local_58._M_str;
        str._M_len = (size_t)str._M_str;
        local_44 = parse_utf8_codepoint((aux *)local_58._M_len,str);
        ::std::tie<int,int>((int *)&k,&local_3c);
        ::std::tuple<int&,int&>::operator=((tuple<int&,int&> *)&k,&local_44);
        if ((local_3c < 0) ||
           (bVar4 = libtorrent::anon_unknown_1::filter_path_character(local_3c), !bVar4)) {
          if ((local_3c < 0) ||
             (bVar4 = libtorrent::anon_unknown_1::valid_path_character(local_3c), !bVar4)) {
            ::std::__cxx11::string::operator+=((string *)_added,'_');
            seq_len = seq_len + 1;
          }
          else {
            for (_j = uStack_38; psVar3 = (string *)_added, _j < uStack_38 + (long)(int)i;
                _j = _j + 1) {
              ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                        ((basic_string_view<char,_std::char_traits<char>_> *)&path_local,_j);
              ::std::__cxx11::string::push_back((char)psVar3);
            }
            if (local_3c == 0x2e) {
              i._7_1_ = i._7_1_ + '\x01';
            }
            seq_len = (int)i + seq_len;
            if ((0xef < seq_len) && ((i._6_1_ & 1) == 0)) {
              local_74 = -1;
              sVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                                ((basic_string_view<char,_std::char_traits<char>_> *)&path_local);
              local_78 = (int)sVar5;
              do {
                local_78 = local_78 + -1;
                iVar1 = local_78;
                sVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&path_local);
                local_7c = (int)sVar5 + -10;
                local_80 = (int)uStack_38;
                piVar8 = ::std::max<int>(&local_7c,&local_80);
                if (iVar1 <= *piVar8) goto LAB_00734be5;
                __pos = numeric_cast<unsigned_long,int,void>(local_78);
                pvVar6 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&path_local,
                                    __pos);
              } while (*pvVar6 != '.');
              local_74 = local_78;
LAB_00734be5:
              if (local_74 == -1) break;
              i._6_1_ = 1;
              uStack_38 = (ulong)(local_74 - (int)i);
            }
          }
        }
      }
      psVar3 = (string *)_added;
      if ((seq_len == i._7_1_) && (seq_len < 3)) {
        local_a0._M_current = (char *)::std::__cxx11::string::end();
        local_98 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_a0,(long)seq_len);
        local_90 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_98,(long)iStack_24);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_88,&local_90);
        local_b0._M_current = (char *)::std::__cxx11::string::end();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_a8,&local_b0);
        ::std::__cxx11::string::erase(psVar3,local_88,local_a8);
      }
      else {
        uVar7 = ::std::__cxx11::string::empty();
        if ((uVar7 & 1) != 0) {
          ::std::__cxx11::string::operator=((string *)_added,"_");
        }
      }
    }
  }
  return;
}

Assistant:

void sanitize_append_path_element(std::string& path, string_view element)
	{
		if (element.size() == 1 && element[0] == '.') return;

#ifdef TORRENT_WINDOWS
#define TORRENT_SEPARATOR '\\'
#else
#define TORRENT_SEPARATOR '/'
#endif
		path.reserve(path.size() + element.size() + 2);
		int added_separator = 0;
		if (!path.empty())
		{
			path += TORRENT_SEPARATOR;
			added_separator = 1;
		}

		if (element.empty())
		{
			path += "_";
			return;
		}

#if !TORRENT_USE_UNC_PATHS && defined TORRENT_WINDOWS
#pragma message ("building for windows without UNC paths is deprecated")

		// if we're not using UNC paths on windows, there
		// are certain filenames we're not allowed to use
		static const char const* reserved_names[] =
		{
			"con", "prn", "aux", "clock$", "nul",
			"com0", "com1", "com2", "com3", "com4",
			"com5", "com6", "com7", "com8", "com9",
			"lpt0", "lpt1", "lpt2", "lpt3", "lpt4",
			"lpt5", "lpt6", "lpt7", "lpt8", "lpt9"
		};
		int num_names = sizeof(reserved_names)/sizeof(reserved_names[0]);

		// this is not very efficient, but it only affects some specific
		// windows builds for now anyway (not even the default windows build)
		std::string pe(element);
		char const* file_end = strrchr(pe.c_str(), '.');
		std::string name = file_end
			? std::string(pe.data(), file_end)
			: pe;
		std::transform(name.begin(), name.end(), name.begin(), &to_lower);
		char const** str = std::find(reserved_names, reserved_names + num_names, name);
		if (str != reserved_names + num_names)
		{
			pe = "_" + pe;
			element = string_view();
		}
#endif
#ifdef TORRENT_WINDOWS
		// this counts the number of unicode characters
		// we've added (which is different from the number
		// of bytes)
		int unicode_chars = 0;
#endif

		int added = 0;
		// the number of dots we've added
		char num_dots = 0;
		bool found_extension = false;

		int seq_len = 0;
		for (std::size_t i = 0; i < element.size(); i += std::size_t(seq_len))
		{
			std::int32_t code_point;
			std::tie(code_point, seq_len) = parse_utf8_codepoint(element.substr(i));

			if (code_point >= 0 && filter_path_character(code_point))
			{
				continue;
			}

			if (code_point < 0 || !valid_path_character(code_point))
			{
				// invalid utf8 sequence, replace with "_"
				path += '_';
				++added;
#ifdef TORRENT_WINDOWS
				++unicode_chars;
#endif
				continue;
			}

			// validation passed, add it to the output string
			for (std::size_t k = i; k < i + std::size_t(seq_len); ++k)
			{
				TORRENT_ASSERT(element[k] != 0);
				path.push_back(element[k]);
			}

			if (code_point == '.') ++num_dots;

			added += seq_len;
#ifdef TORRENT_WINDOWS
			++unicode_chars;
#endif

			// any given path element should not
			// be more than 255 characters
			// if we exceed 240, pick up any potential
			// file extension and add that too
#ifdef TORRENT_WINDOWS
			if (unicode_chars >= 240 && !found_extension)
#else
			if (added >= 240 && !found_extension)
#endif
			{
				int dot = -1;
				for (int j = int(element.size()) - 1;
					j > std::max(int(element.size()) - 10, int(i)); --j)
				{
					if (element[aux::numeric_cast<std::size_t>(j)] != '.') continue;
					dot = j;
					break;
				}
				// there is no extension
				if (dot == -1) break;
				found_extension = true;
				TORRENT_ASSERT(dot > 0);
				i = std::size_t(dot - seq_len);
			}
		}

		if (added == num_dots && added <= 2)
		{
			// revert everything
			path.erase(path.end() - added - added_separator, path.end());
			return;
		}

#ifdef TORRENT_WINDOWS
		// remove trailing spaces and dots. These aren't allowed in filenames on windows
		for (int i = int(path.size()) - 1; i >= 0; --i)
		{
			if (path[i] != ' ' && path[i] != '.') break;
			path.resize(i);
			--added;
			TORRENT_ASSERT(added >= 0);
		}

		if (added == 0 && added_separator)
		{
			// remove the separator added at the beginning
			path.erase(path.end() - 1);
			return;
		}
#endif

		if (path.empty()) path = "_";
	}